

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O0

bool __thiscall
irr::io::CArchiveLoaderZIP::isALoadableFileFormat(CArchiveLoaderZIP *this,IReadFile *file)

{
  undefined8 *in_RSI;
  SZIPFileHeader header;
  bool local_2f;
  uint local_2e [11];
  
  (**(code **)*in_RSI)(in_RSI,local_2e,4);
  local_2f = local_2e[0] == 0x4034b50 || (local_2e[0] & 0xffff) == 0x8b1f;
  return local_2f;
}

Assistant:

bool CArchiveLoaderZIP::isALoadableFileFormat(io::IReadFile *file) const
{
	SZIPFileHeader header;

	file->read(&header.Sig, 4);
#ifdef __BIG_ENDIAN__
	header.Sig = os::Byteswap::byteswap(header.Sig);
#endif

	return header.Sig == 0x04034b50 ||      // ZIP
		   (header.Sig & 0xffff) == 0x8b1f; // gzip
}